

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::avx::BVH4BuilderTwoLevelQuadMeshSAH(void *bvh,Scene *scene,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this;
  
  this = (BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_> *)::operator_new(0xa8);
  BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,MTY_QUAD_MESH,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH4BuilderTwoLevelQuadMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,QuadMesh,Quad4v>((BVH4*)bvh,scene,QuadMesh::geom_type,useMortonBuilder);
    }